

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O3

void __thiscall HdlcAnalyzer::BitSyncProcessFlags(HdlcAnalyzer *this)

{
  char cVar1;
  bool bVar2;
  BitState BVar3;
  U64 UVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  vector<HdlcByte,_std::allocator<HdlcByte>_> flags;
  Frame frame;
  HdlcByte *local_88;
  iterator iStack_80;
  HdlcByte *local_78;
  HdlcByte local_68;
  undefined8 uStack_50;
  undefined2 local_48;
  U64 local_38;
  U64 UStack_30;
  
  local_88 = (HdlcByte *)0x0;
  iStack_80._M_current = (HdlcByte *)0x0;
  local_78 = (HdlcByte *)0x0;
  bVar9 = false;
LAB_00108701:
  do {
    cVar1 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)this->mHdlc);
    if (cVar1 == '\0') {
      if (iStack_80._M_current != local_88) {
        uVar8 = 0;
        uVar6 = 1;
        do {
          local_38 = local_88[uVar8].startSample;
          UStack_30 = local_88[uVar8].endSample;
          Frame::Frame((Frame *)&local_68);
          local_68.startSample = local_38;
          local_68.endSample = UStack_30;
          local_48 = 0;
          local_68.value = '\x02';
          local_68.escaped = false;
          local_68._18_6_ = 0;
          uStack_50 = 0;
          std::vector<Frame,_std::allocator<Frame>_>::push_back
                    (&this->mResultFrames,(value_type *)&local_68);
          Frame::~Frame((Frame *)&local_68);
          uVar8 = ((long)iStack_80._M_current - (long)local_88 >> 3) * -0x5555555555555555;
          bVar9 = uVar6 <= uVar8;
          lVar5 = uVar8 - uVar6;
          uVar8 = uVar6;
          uVar6 = (ulong)((int)uVar6 + 1);
        } while (bVar9 && lVar5 != 0);
      }
      if (iStack_80._M_current != local_88) {
        iStack_80._M_current = local_88;
      }
      UVar4 = AnalyzerChannelData::GetSampleNumber();
      lVar5 = AnalyzerChannelData::GetSampleNumber();
      uVar7 = this->mSamplesIn8Bits;
      Frame::Frame((Frame *)&local_68);
      local_68.endSample = lVar5 + (ulong)uVar7;
      local_48 = 7;
      local_68.value = '\0';
      local_68.escaped = false;
      local_68._18_6_ = 0;
      uStack_50 = 0;
      *(undefined8 *)&this->field_0xa8 = 0;
      *(undefined8 *)&this->field_0xb0 = 0;
      *(undefined2 *)&this->field_0xb8 = 7;
      *(U64 *)&this->mAbtFrame = UVar4;
      *(U64 *)&this->field_0xa0 = local_68.endSample;
      local_68.startSample = UVar4;
      Frame::~Frame((Frame *)&local_68);
      AnalyzerChannelData::AdvanceToNextEdge();
      this->mAbortFrame = true;
LAB_001089e6:
      if (local_88 != (HdlcByte *)0x0) {
        operator_delete(local_88);
      }
      return;
    }
    bVar2 = FlagComing(this);
    if (!bVar2) {
      if (bVar9 != false) {
        if (((this->mAbortFrame & 1U) == 0) && (iStack_80._M_current != local_88)) {
          uVar7 = 1;
          uVar8 = 0;
          do {
            local_38 = local_88[uVar8].startSample;
            UStack_30 = local_88[uVar8].endSample;
            Frame::Frame((Frame *)&local_68);
            local_68.startSample = local_38;
            local_68.endSample = UStack_30;
            local_48 = 0;
            local_68.value = '\x02';
            local_68.escaped = false;
            local_68._18_6_ = 0;
            uStack_50 = 0;
            if (((long)iStack_80._M_current - (long)local_88 >> 3) * -0x5555555555555555 - 1U ==
                uVar8) {
              local_68.value = '\0';
              local_68.escaped = false;
              local_68._18_6_ = 0;
            }
            std::vector<Frame,_std::allocator<Frame>_>::push_back
                      (&this->mResultFrames,(value_type *)&local_68);
            Frame::~Frame((Frame *)&local_68);
            uVar8 = (ulong)uVar7;
            uVar6 = ((long)iStack_80._M_current - (long)local_88 >> 3) * -0x5555555555555555;
            uVar7 = uVar7 + 1;
          } while (uVar8 <= uVar6 && uVar6 - uVar8 != 0);
        }
        goto LAB_001089e6;
      }
      AnalyzerChannelData::AdvanceToNextEdge();
      bVar9 = bVar2;
      goto LAB_00108701;
    }
    local_68._16_8_ = local_68._16_8_ & 0xffffffffffffff00;
    local_68.startSample = AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToNextEdge();
    local_68.endSample = AnalyzerChannelData::GetSampleNumber();
    if (iStack_80._M_current == local_78) {
      std::vector<HdlcByte,std::allocator<HdlcByte>>::_M_realloc_insert<HdlcByte_const&>
                ((vector<HdlcByte,std::allocator<HdlcByte>> *)&local_88,iStack_80,&local_68);
    }
    else {
      (iStack_80._M_current)->value = local_68.value;
      (iStack_80._M_current)->escaped = local_68.escaped;
      *(undefined6 *)&(iStack_80._M_current)->field_0x12 = local_68._18_6_;
      (iStack_80._M_current)->startSample = local_68.startSample;
      (iStack_80._M_current)->endSample = local_68.endSample;
      iStack_80._M_current = iStack_80._M_current + 1;
    }
    cVar1 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)this->mHdlc);
    uVar7 = (uint)this->mHdlc;
    if (cVar1 == '\0') {
      AnalyzerChannelData::Advance(uVar7);
      BVar3 = AnalyzerChannelData::GetBitState();
      this->mPreviousBitState = BVar3;
      AnalyzerChannelData::Advance((uint)this->mHdlc);
      bVar9 = bVar2;
    }
    else {
      AnalyzerChannelData::Advance(uVar7);
      BVar3 = AnalyzerChannelData::GetBitState();
      this->mPreviousBitState = BVar3;
      AnalyzerChannelData::AdvanceToNextEdge();
      bVar9 = bVar2;
    }
  } while( true );
}

Assistant:

void HdlcAnalyzer::BitSyncProcessFlags()
{
    bool flagEncountered = false;
    vector<HdlcByte> flags;
    for( ;; )
    {
        if( AbortComing() )
        {
            // Show fill flags
            for( U32 i = 0; i < flags.size(); ++i )
            {
                Frame frame = CreateFrame( HDLC_FIELD_FLAG, flags.at( i ).startSample, flags.at( i ).endSample, HDLC_FLAG_FILL );
                AddFrameToResults( frame );
            }
            flags.clear();

            mAbtFrame = CreateFrame( HDLC_ABORT_SEQ, mHdlc->GetSampleNumber(), mHdlc->GetSampleNumber() + mSamplesIn8Bits );

            mHdlc->AdvanceToNextEdge();
            flagEncountered = false;
            mAbortFrame = true;

            break;
        }

        if( FlagComing() )
        {
            HdlcByte bs;
            bs.value = 0;

            bs.startSample = mHdlc->GetSampleNumber();
            mHdlc->AdvanceToNextEdge();
            bs.endSample = mHdlc->GetSampleNumber();

            flags.push_back( bs );

            if( mHdlc->WouldAdvancingCauseTransition( mSamplesInHalfPeriod * 1.5 ) )
            {
                mHdlc->Advance( mSamplesInHalfPeriod * 0.5 );
                mPreviousBitState = mHdlc->GetBitState();
                mHdlc->AdvanceToNextEdge();
            }
            else
            {
                mHdlc->Advance( mSamplesInHalfPeriod * 0.5 );
                mPreviousBitState = mHdlc->GetBitState();
                mHdlc->Advance( mSamplesInHalfPeriod * 0.5 );
            }

            flagEncountered = true;
        }
        else // non-flag
        {
            if( flagEncountered )
            {
                break;
            }
            else // non-flag byte before a byte-flag is ignored
            {
                mHdlc->AdvanceToNextEdge();
            }
        }
    }

    if( !mAbortFrame )
    {
        for( U32 i = 0; i < flags.size(); ++i )
        {
            Frame frame = CreateFrame( HDLC_FIELD_FLAG, flags.at( i ).startSample, flags.at( i ).endSample, HDLC_FLAG_FILL );
            if( i == flags.size() - 1 )
            {
                frame.mData1 = HDLC_FLAG_START;
            }
            AddFrameToResults( frame );
        }
    }
}